

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O1

void __thiscall
MeshSplitter::SplitMesh
          (MeshSplitter *this,uint a,aiMesh *in_mesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  aiBone ***pppaVar1;
  aiColor4D *paVar2;
  pointer *pppVar3;
  uint uVar4;
  uint uVar5;
  aiVector3D *paVar6;
  pointer ppVar7;
  aiBone *paVar8;
  iterator iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  pointer paVar25;
  pointer paVar26;
  uint c_2;
  int iVar27;
  uint uVar28;
  VertexWeightTable *pVVar29;
  aiVertexWeight aVar30;
  aiBone **ppaVar31;
  aiVector3D *paVar32;
  aiColor4D *paVar33;
  void *pvVar34;
  uint *puVar35;
  aiBone *paVar36;
  aiBone *paVar37;
  ulong uVar38;
  aiVertexWeight *__s;
  ulong *puVar39;
  aiFace *paVar40;
  uint uVar41;
  aiFace *paVar42;
  ulong uVar43;
  uint c;
  uint uVar44;
  long lVar45;
  pointer *pppVar46;
  pointer ppVar47;
  ulong uVar48;
  ulong uVar49;
  bool bVar50;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> was_copied_to;
  aiBone **local_4d0;
  vector<aiFace,_std::allocator<aiFace>_> local_4a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  VertexWeightTable *local_468;
  VertexWeightTable *local_460;
  char *local_458;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_450
  ;
  ulong local_448;
  MeshSplitter *local_440;
  undefined1 local_438 [8];
  uint *puStack_430;
  
  if (this->LIMIT < in_mesh->mNumVertices) {
    pVVar29 = ComputeVertexBoneWeightTable(in_mesh);
    uVar44 = in_mesh->mNumVertices;
    uVar4 = this->LIMIT;
    local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_438._0_4_ = 0xffffffff;
    local_440 = this;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_488,(ulong)uVar44,(value_type_conflict1 *)local_438);
    uVar48 = (ulong)in_mesh->mNumFaces / (ulong)(uVar44 / uVar4 + 1);
    local_448 = (ulong)(uint)((int)(uVar48 >> 3) + (int)uVar48);
    local_458 = (in_mesh->mName).data;
    uVar44 = 0;
    local_468 = pVVar29;
    local_460 = pVVar29;
    local_450 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                 *)source_mesh_map;
    do {
      uVar4 = local_440->LIMIT;
      aVar30 = (aiVertexWeight)operator_new(0x520);
      *(undefined8 *)aVar30 = 0;
      *(uint *)((long)aVar30 + 8) = 0;
      memset((aiVector3D **)((long)aVar30 + 0x10),0,0xcc);
      *(aiBone ***)((long)aVar30 + 0xe0) = (aiBone **)0x0;
      *(undefined8 *)((long)aVar30 + 0xe8) = 0;
      *(char *)((long)aVar30 + 0xf0) = '\0';
      memset((char *)((long)aVar30 + 0xf1),0x1b,0x3ff);
      *(uint *)((long)aVar30 + 0x4f0) = 0;
      *(aiAnimMesh ***)((long)aVar30 + 0x4f8) = (aiAnimMesh **)0x0;
      *(undefined8 *)((long)aVar30 + 0x500) = 0;
      *(undefined8 *)((long)aVar30 + 0x508) = 0;
      ((aiVector3D *)((long)aVar30 + 0x510))->x = 0.0;
      ((aiVector3D *)((long)aVar30 + 0x510))->y = 0.0;
      *(float *)((long)aVar30 + 0x518) = 0.0;
      *(aiVector3D **)((long)aVar30 + 0x70) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0x78) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0x80) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0x88) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0x90) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0x98) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0xa0) = (aiVector3D *)0x0;
      *(aiVector3D **)((long)aVar30 + 0xa8) = (aiVector3D *)0x0;
      ((uint *)((long)aVar30 + 0xb0))[0] = 0;
      ((uint *)((long)aVar30 + 0xb0))[1] = 0;
      ((uint *)((long)aVar30 + 0xb8))[0] = 0;
      ((uint *)((long)aVar30 + 0xb8))[1] = 0;
      ((uint *)((long)aVar30 + 0xc0))[0] = 0;
      ((uint *)((long)aVar30 + 0xc0))[1] = 0;
      ((uint *)((long)aVar30 + 200))[0] = 0;
      ((uint *)((long)aVar30 + 200))[1] = 0;
      *(aiColor4D **)((long)aVar30 + 0x30) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x38) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x40) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x48) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x50) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x58) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x60) = (aiColor4D *)0x0;
      *(aiColor4D **)((long)aVar30 + 0x68) = (aiColor4D *)0x0;
      *(uint *)((long)aVar30 + 4) = 0;
      *(uint *)((long)aVar30 + 0xe8) = in_mesh->mMaterialIndex;
      if (aVar30 != (aiVertexWeight)in_mesh) {
        uVar5 = (in_mesh->mName).length;
        ((aiString *)((long)aVar30 + 0xec))->length = uVar5;
        memcpy((char *)((long)aVar30 + 0xf0),local_458,(ulong)uVar5);
        ((char *)((long)aVar30 + 0xf0))[uVar5] = '\0';
      }
      pppaVar1 = (aiBone ***)((long)aVar30 + 0xe0);
      if (in_mesh->mNumBones != 0 && in_mesh->mBones != (aiBone **)0x0) {
        uVar48 = (ulong)in_mesh->mNumBones << 3;
        ppaVar31 = (aiBone **)operator_new__(uVar48);
        memset(ppaVar31,0,uVar48);
        *pppaVar1 = ppaVar31;
      }
      if ((uVar44 != 0) &&
         (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        memset(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0xff,
               ((long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                (-4 - (long)local_488.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar5 = in_mesh->mNumVertices;
      uVar48 = (ulong)uVar4;
      if (uVar5 != 0 && in_mesh->mVertices != (aiVector3D *)0x0) {
        paVar32 = (aiVector3D *)operator_new__(uVar48 * 0xc);
        if (uVar4 != 0) {
          memset(paVar32,0,((uVar48 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(aiVector3D **)((long)aVar30 + 0x10) = paVar32;
      }
      if (in_mesh->mNormals != (aiVector3D *)0x0 && uVar5 != 0) {
        paVar32 = (aiVector3D *)operator_new__(uVar48 * 0xc);
        if (uVar4 != 0) {
          memset(paVar32,0,((uVar48 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(aiVector3D **)((long)aVar30 + 0x18) = paVar32;
      }
      if ((in_mesh->mBitangents != (aiVector3D *)0x0 && in_mesh->mTangents != (aiVector3D *)0x0) &&
          uVar5 != 0) {
        paVar32 = (aiVector3D *)operator_new__(uVar48 * 0xc);
        if (uVar4 != 0) {
          memset(paVar32,0,((uVar48 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(aiVector3D **)((long)aVar30 + 0x20) = paVar32;
        paVar32 = (aiVector3D *)operator_new__(uVar48 * 0xc);
        if (uVar4 != 0) {
          memset(paVar32,0,((uVar48 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(aiVector3D **)((long)aVar30 + 0x28) = paVar32;
      }
      if (uVar5 != 0) {
        lVar45 = 0;
        do {
          if (in_mesh->mColors[lVar45] == (aiColor4D *)0x0) break;
          paVar33 = (aiColor4D *)operator_new__(uVar48 << 4);
          if (uVar4 != 0) {
            memset(paVar33,0,uVar48 << 4);
          }
          ((aiColor4D **)((long)aVar30 + 0x30))[lVar45] = paVar33;
          lVar45 = lVar45 + 1;
        } while (lVar45 != 8);
      }
      if (uVar5 != 0) {
        lVar45 = 0;
        do {
          if (*(long *)((long)in_mesh->mTextureCoords + lVar45 * 2) == 0) break;
          *(undefined4 *)((long)((long)aVar30 + 0xb0) + lVar45) =
               *(undefined4 *)((long)in_mesh->mNumUVComponents + lVar45);
          pvVar34 = operator_new__(uVar48 * 0xc);
          if (uVar4 != 0) {
            memset(pvVar34,0,((uVar48 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)((long)((long)aVar30 + 0x70) + lVar45 * 2) = pvVar34;
          lVar45 = lVar45 + 4;
        } while (lVar45 != 0x20);
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve(&local_4a8,local_448);
      do {
        if (in_mesh->mNumFaces <= uVar44) break;
        uVar5 = in_mesh->mFaces[uVar44].mNumIndices;
        uVar48 = (ulong)uVar5;
        if (uVar48 == 0) {
          iVar27 = 0;
        }
        else {
          uVar43 = 0;
          iVar27 = 0;
          do {
            iVar27 = iVar27 + (uint)(local_488.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [in_mesh->mFaces[uVar44].mIndices[uVar43]] == 0xffffffff);
            uVar43 = uVar43 + 1;
          } while (uVar48 != uVar43);
        }
        if (uVar4 < iVar27 + *(uint *)((long)aVar30 + 4)) {
          bVar50 = false;
        }
        else {
          local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
          puStack_430 = (uint *)0x0;
          std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                    (&local_4a8,(aiFace *)local_438);
          if (puStack_430 != (uint *)0x0) {
            operator_delete__(puStack_430);
          }
          paVar25 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].mNumIndices = uVar5;
          puVar35 = (uint *)operator_new__(uVar48 * 4);
          paVar25[-1].mIndices = puVar35;
          uVar41 = paVar25[-1].mNumIndices - 1;
          uVar28 = 8;
          if (uVar41 < 3) {
            uVar28 = *(uint *)(&DAT_006d3938 + (ulong)uVar41 * 4);
          }
          *(uint *)aVar30 = uVar28 | *(uint *)aVar30;
          if (uVar5 != 0) {
            uVar43 = 0;
            do {
              uVar5 = in_mesh->mFaces[uVar44].mIndices[uVar43];
              if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] == 0xffffffff) {
                paVar32 = in_mesh->mVertices;
                paVar6 = *(aiVector3D **)((long)aVar30 + 0x10);
                uVar28 = *(uint *)((long)aVar30 + 4);
                paVar6[uVar28].z = paVar32[uVar5].z;
                paVar32 = paVar32 + uVar5;
                fVar10 = paVar32->y;
                paVar6 = paVar6 + uVar28;
                paVar6->x = paVar32->x;
                paVar6->y = fVar10;
                paVar32 = in_mesh->mNormals;
                if ((paVar32 != (aiVector3D *)0x0) && (in_mesh->mNumVertices != 0)) {
                  paVar6 = *(aiVector3D **)((long)aVar30 + 0x18);
                  uVar28 = *(uint *)((long)aVar30 + 4);
                  paVar6[uVar28].z = paVar32[uVar5].z;
                  fVar10 = paVar32[uVar5].y;
                  paVar6 = paVar6 + uVar28;
                  paVar6->x = paVar32[uVar5].x;
                  paVar6->y = fVar10;
                }
                paVar32 = in_mesh->mTangents;
                if (((paVar32 != (aiVector3D *)0x0) && (in_mesh->mBitangents != (aiVector3D *)0x0))
                   && (in_mesh->mNumVertices != 0)) {
                  paVar6 = *(aiVector3D **)((long)aVar30 + 0x20);
                  uVar28 = *(uint *)((long)aVar30 + 4);
                  paVar6[uVar28].z = paVar32[uVar5].z;
                  fVar10 = paVar32[uVar5].y;
                  paVar6 = paVar6 + uVar28;
                  paVar6->x = paVar32[uVar5].x;
                  paVar6->y = fVar10;
                  paVar32 = in_mesh->mBitangents;
                  paVar6 = *(aiVector3D **)((long)aVar30 + 0x28);
                  uVar28 = *(uint *)((long)aVar30 + 4);
                  paVar6[uVar28].z = paVar32[uVar5].z;
                  paVar32 = paVar32 + uVar5;
                  fVar10 = paVar32->y;
                  paVar6 = paVar6 + uVar28;
                  paVar6->x = paVar32->x;
                  paVar6->y = fVar10;
                }
                lVar45 = 0;
                do {
                  if ((in_mesh->mTextureCoords[lVar45] != (aiVector3D *)0x0) &&
                     (in_mesh->mNumVertices != 0)) {
                    paVar32 = in_mesh->mTextureCoords[lVar45];
                    paVar6 = ((aiVector3D **)((long)aVar30 + 0x70))[lVar45];
                    uVar28 = *(uint *)((long)aVar30 + 4);
                    paVar6[uVar28].z = paVar32[uVar5].z;
                    paVar32 = paVar32 + uVar5;
                    fVar10 = paVar32->y;
                    paVar6 = paVar6 + uVar28;
                    paVar6->x = paVar32->x;
                    paVar6->y = fVar10;
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 8);
                lVar45 = 0;
                do {
                  if ((in_mesh->mColors[lVar45] != (aiColor4D *)0x0) && (in_mesh->mNumVertices != 0)
                     ) {
                    paVar33 = in_mesh->mColors[lVar45] + uVar5;
                    fVar10 = paVar33->g;
                    fVar11 = paVar33->b;
                    fVar12 = paVar33->a;
                    paVar2 = ((aiColor4D **)((long)aVar30 + 0x30))[lVar45] +
                             *(uint *)((long)aVar30 + 4);
                    paVar2->r = paVar33->r;
                    paVar2->g = fVar10;
                    paVar2->b = fVar11;
                    paVar2->a = fVar12;
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 8);
                paVar25[-1].mIndices[uVar43] = *(uint *)((long)aVar30 + 4);
                if (local_460 != (VertexWeightTable *)0x0) {
                  ppVar7 = local_468[*(uint *)((long)aVar30 + 4)].
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppVar47 = local_468[*(uint *)((long)aVar30 + 4)].
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; ppVar47 != ppVar7;
                      ppVar47 = ppVar47 + 1) {
                    ppaVar31 = *pppaVar1;
                    paVar36 = ppaVar31[ppVar47->first];
                    if (paVar36 == (aiBone *)0x0) {
                      paVar36 = (aiBone *)operator_new(0x18);
                      (paVar36->mName).length = 0;
                      (paVar36->mName).data[0] = '\0';
                      (paVar36->mName).data[1] = '\0';
                      (paVar36->mName).data[2] = '\0';
                      (paVar36->mName).data[3] = '\0';
                      (paVar36->mName).data[4] = '\0';
                      (paVar36->mName).data[5] = '\0';
                      (paVar36->mName).data[6] = '\0';
                      (paVar36->mName).data[7] = '\0';
                      (paVar36->mName).data[8] = '\0';
                      (paVar36->mName).data[9] = '\0';
                      (paVar36->mName).data[10] = '\0';
                      (paVar36->mName).data[0xb] = '\0';
                      (paVar36->mName).data[0xc] = '\0';
                      (paVar36->mName).data[0xd] = '\0';
                      (paVar36->mName).data[0xe] = '\0';
                      (paVar36->mName).data[0xf] = '\0';
                      (paVar36->mName).data[0x10] = '\0';
                      (paVar36->mName).data[0x11] = '\0';
                      (paVar36->mName).data[0x12] = '\0';
                      (paVar36->mName).data[0x13] = '\0';
                      ppaVar31[ppVar47->first] = paVar36;
                    }
                    local_438._4_4_ = ppVar47->second;
                    local_438._0_4_ = *(uint *)((long)aVar30 + 4);
                    std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                    emplace_back<aiVertexWeight>
                              ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar36,
                               (aiVertexWeight *)local_438);
                  }
                }
                local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5] = *(uint *)((long)aVar30 + 4);
                *(uint *)((long)aVar30 + 4) = *(uint *)((long)aVar30 + 4) + 1;
              }
              else {
                paVar25[-1].mIndices[uVar43] =
                     local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar5];
              }
              uVar43 = uVar43 + 1;
            } while (uVar43 != uVar48);
          }
          uVar44 = uVar44 + 1;
          bVar50 = *(uint *)((long)aVar30 + 4) != uVar4;
        }
      } while (bVar50);
      if (((in_mesh->mBones != (aiBone **)0x0) && (in_mesh->mNumBones != 0)) &&
         (in_mesh->mNumBones != 0)) {
        local_4d0 = *(aiBone ***)((long)aVar30 + 0xe0);
        uVar48 = 0;
        do {
          paVar36 = (*pppaVar1)[uVar48];
          if (paVar36 != (aiBone *)0x0) {
            paVar8 = in_mesh->mBones[uVar48];
            paVar37 = (aiBone *)operator_new(0x460);
            (paVar37->mName).length = 0;
            (paVar37->mName).data[0] = '\0';
            memset((paVar37->mName).data + 1,0x1b,0x3ff);
            paVar37->mNumWeights = 0;
            paVar37->mWeights = (aiVertexWeight *)0x0;
            (paVar37->mOffsetMatrix).a1 = 1.0;
            (paVar37->mOffsetMatrix).a2 = 0.0;
            (paVar37->mOffsetMatrix).a3 = 0.0;
            (paVar37->mOffsetMatrix).a4 = 0.0;
            (paVar37->mOffsetMatrix).b1 = 0.0;
            (paVar37->mOffsetMatrix).b2 = 1.0;
            (paVar37->mOffsetMatrix).b3 = 0.0;
            (paVar37->mOffsetMatrix).b4 = 0.0;
            (paVar37->mOffsetMatrix).c1 = 0.0;
            (paVar37->mOffsetMatrix).c2 = 0.0;
            (paVar37->mOffsetMatrix).c3 = 1.0;
            (paVar37->mOffsetMatrix).c4 = 0.0;
            (paVar37->mOffsetMatrix).d1 = 0.0;
            (paVar37->mOffsetMatrix).d2 = 0.0;
            (paVar37->mOffsetMatrix).d3 = 0.0;
            (paVar37->mOffsetMatrix).d4 = 1.0;
            *local_4d0 = paVar37;
            uVar4 = (paVar8->mName).length;
            if (0x3fe < uVar4) {
              uVar4 = 0x3ff;
            }
            uVar43 = (ulong)uVar4;
            local_438._0_4_ = uVar4;
            memcpy(local_438 + 4,(paVar8->mName).data,uVar43);
            local_438[uVar43 + 4] = 0;
            (paVar37->mName).length = uVar4;
            memcpy((paVar37->mName).data,local_438 + 4,uVar43);
            (paVar37->mName).data[uVar43] = '\0';
            fVar21 = (paVar8->mOffsetMatrix).a1;
            fVar22 = (paVar8->mOffsetMatrix).a2;
            fVar23 = (paVar8->mOffsetMatrix).a3;
            fVar24 = (paVar8->mOffsetMatrix).a4;
            fVar17 = (paVar8->mOffsetMatrix).b1;
            fVar18 = (paVar8->mOffsetMatrix).b2;
            fVar19 = (paVar8->mOffsetMatrix).b3;
            fVar20 = (paVar8->mOffsetMatrix).b4;
            fVar13 = (paVar8->mOffsetMatrix).c1;
            fVar14 = (paVar8->mOffsetMatrix).c2;
            fVar15 = (paVar8->mOffsetMatrix).c3;
            fVar16 = (paVar8->mOffsetMatrix).c4;
            fVar10 = (paVar8->mOffsetMatrix).d2;
            fVar11 = (paVar8->mOffsetMatrix).d3;
            fVar12 = (paVar8->mOffsetMatrix).d4;
            (paVar37->mOffsetMatrix).d1 = (paVar8->mOffsetMatrix).d1;
            (paVar37->mOffsetMatrix).d2 = fVar10;
            (paVar37->mOffsetMatrix).d3 = fVar11;
            (paVar37->mOffsetMatrix).d4 = fVar12;
            (paVar37->mOffsetMatrix).c1 = fVar13;
            (paVar37->mOffsetMatrix).c2 = fVar14;
            (paVar37->mOffsetMatrix).c3 = fVar15;
            (paVar37->mOffsetMatrix).c4 = fVar16;
            (paVar37->mOffsetMatrix).b1 = fVar17;
            (paVar37->mOffsetMatrix).b2 = fVar18;
            (paVar37->mOffsetMatrix).b3 = fVar19;
            (paVar37->mOffsetMatrix).b4 = fVar20;
            (paVar37->mOffsetMatrix).a1 = fVar21;
            (paVar37->mOffsetMatrix).a2 = fVar22;
            (paVar37->mOffsetMatrix).a3 = fVar23;
            (paVar37->mOffsetMatrix).a4 = fVar24;
            uVar49 = *(long *)((paVar36->mName).data + 4) - *(long *)&paVar36->mName;
            uVar38 = (long)uVar49 >> 3;
            paVar37->mNumWeights = (uint)uVar38;
            uVar38 = uVar38 & 0xffffffff;
            uVar43 = uVar38 * 8;
            __s = (aiVertexWeight *)operator_new__(uVar43);
            if (uVar38 != 0) {
              memset(__s,0,uVar43);
            }
            paVar37->mWeights = __s;
            memcpy(__s,*(void **)&paVar36->mName,uVar49 & 0x7fffffff8);
            pvVar34 = *(void **)&paVar36->mName;
            if (pvVar34 != (void *)0x0) {
              operator_delete(pvVar34,*(long *)((paVar36->mName).data + 0xc) - (long)pvVar34);
            }
            local_4d0 = local_4d0 + 1;
            operator_delete(paVar36,0x18);
            *(uint *)((long)aVar30 + 0xd8) = *(uint *)((long)aVar30 + 0xd8) + 1;
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 < in_mesh->mNumBones);
      }
      paVar26 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      paVar25 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar48 = (long)local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar43 = (long)uVar48 >> 4;
      puVar39 = (ulong *)operator_new__(-(ulong)(uVar43 >> 0x3c != 0) | uVar48 | 8);
      *puVar39 = uVar43;
      paVar40 = (aiFace *)(puVar39 + 1);
      if (paVar26 != paVar25) {
        paVar42 = paVar40;
        do {
          paVar42->mNumIndices = 0;
          paVar42->mIndices = (uint *)0x0;
          paVar42 = paVar42 + 1;
        } while (paVar42 != (aiFace *)(uVar48 + (long)paVar40));
      }
      *(aiFace **)((long)aVar30 + 0xd0) = paVar40;
      *(uint *)((long)aVar30 + 8) = (uint)uVar43;
      if ((uint)uVar43 != 0) {
        lVar45 = 0;
        uVar48 = 0;
        do {
          aiFace::operator=((aiFace *)
                            ((long)&(*(aiFace **)((long)aVar30 + 0xd0))->mNumIndices + lVar45),
                            (aiFace *)
                            ((long)&(local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar45
                            ));
          uVar48 = uVar48 + 1;
          lVar45 = lVar45 + 0x10;
        } while (uVar48 < *(uint *)((long)aVar30 + 8));
      }
      puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
      iVar9._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 8);
      local_438 = (undefined1  [8])aVar30;
      if (iVar9._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 0x10)) {
        std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
        ::_M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                  (local_450,iVar9,(pair<aiMesh_*,_unsigned_int> *)local_438);
      }
      else {
        (iVar9._M_current)->first = (aiMesh *)aVar30;
        *(uint **)&(iVar9._M_current)->second = puStack_430;
        *(long *)(local_450 + 8) = *(long *)(local_450 + 8) + 0x10;
      }
      uVar4 = in_mesh->mNumFaces;
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_4a8);
      pVVar29 = local_460;
    } while (uVar44 != uVar4);
    if (local_460 != (VertexWeightTable *)0x0) {
      pppVar46 = &local_460[-1].
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppVar47 = local_468[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (ppVar47 != (pointer)0x0) {
        lVar45 = (long)ppVar47 * 0x18;
        do {
          pvVar34 = *(void **)((long)&pVVar29[-1].
                                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar45);
          if (pvVar34 != (void *)0x0) {
            operator_delete(pvVar34,*(long *)((long)pppVar46 + lVar45) - (long)pvVar34);
          }
          lVar45 = lVar45 + -0x18;
        } while (lVar45 != 0);
      }
      operator_delete__(pppVar46,(long)ppVar47 * 0x18 + 8);
    }
    if (in_mesh != (aiMesh *)0x0) {
      aiMesh::~aiMesh(in_mesh);
      operator_delete(in_mesh,0x520);
    }
    if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_488.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_488.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar9._M_current =
         (source_mesh_map->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (source_mesh_map->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_438 = (undefined1  [8])in_mesh;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)source_mesh_map,iVar9,(pair<aiMesh_*,_unsigned_int> *)local_438);
    }
    else {
      (iVar9._M_current)->first = in_mesh;
      *(uint **)&(iVar9._M_current)->second = puStack_430;
      pppVar3 = &(source_mesh_map->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar3 = *pppVar3 + 1;
    }
  }
  return;
}

Assistant:

void MeshSplitter :: SplitMesh(unsigned int a, aiMesh* in_mesh, std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	if (in_mesh->mNumVertices <= LIMIT)	{
		source_mesh_map.push_back(std::make_pair(in_mesh,a));
		return;
	}

	// build a per-vertex weight list if necessary
	VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(in_mesh);

	// we need to split this mesh into sub meshes. Estimate submesh size
	const unsigned int sub_meshes = (in_mesh->mNumVertices / LIMIT) + 1;

	// create a std::vector<unsigned int> to remember which vertices have already 
	// been copied and to which position (i.e. output index)
	std::vector<unsigned int> was_copied_to;
	was_copied_to.resize(in_mesh->mNumVertices,WAS_NOT_COPIED);

	// Try to find a good estimate for the number of output faces
	// per mesh. Add 12.5% as buffer
	unsigned int size_estimated = in_mesh->mNumFaces / sub_meshes;
	size_estimated += size_estimated / 8;

	// now generate all submeshes
	unsigned int base = 0;
	while (true) {
		const unsigned int out_vertex_index = LIMIT;

		aiMesh* out_mesh = new aiMesh();			
		out_mesh->mNumVertices = 0;
		out_mesh->mMaterialIndex = in_mesh->mMaterialIndex;

		// the name carries the adjacency information between the meshes
		out_mesh->mName = in_mesh->mName;

		typedef std::vector<aiVertexWeight> BoneWeightList;
		if (in_mesh->HasBones())	{
			out_mesh->mBones = new aiBone*[in_mesh->mNumBones]();
		}

		// clear the temporary helper array
		if (base)	{
			std::fill(was_copied_to.begin(), was_copied_to.end(), WAS_NOT_COPIED);
		}

		std::vector<aiFace> vFaces;

		// reserve enough storage for most cases
		if (in_mesh->HasPositions()) {
			out_mesh->mVertices = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasNormals()) {
			out_mesh->mNormals = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasTangentsAndBitangents())	{
			out_mesh->mTangents = new aiVector3D[out_vertex_index];
			out_mesh->mBitangents = new aiVector3D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasVertexColors(c);++c)	{
			out_mesh->mColors[c] = new aiColor4D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasTextureCoords(c);++c)	{
			out_mesh->mNumUVComponents[c] = in_mesh->mNumUVComponents[c];
			out_mesh->mTextureCoords[c] = new aiVector3D[out_vertex_index];
		}
		vFaces.reserve(size_estimated);

		// (we will also need to copy the array of indices)
		while (base < in_mesh->mNumFaces) {
			const unsigned int iNumIndices = in_mesh->mFaces[base].mNumIndices;

			// doesn't catch degenerates but is quite fast
			unsigned int iNeed = 0;
			for (unsigned int v = 0; v < iNumIndices;++v)	{
				unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED == was_copied_to[index])	{
					iNeed++; 
				}
			}
			if (out_mesh->mNumVertices + iNeed > out_vertex_index)	{
				// don't use this face
				break;
			}

			vFaces.push_back(aiFace());
			aiFace& rFace = vFaces.back();

			// setup face type and number of indices
			rFace.mNumIndices = iNumIndices;
			rFace.mIndices = new unsigned int[iNumIndices];

			// need to update the output primitive types
			switch (rFace.mNumIndices)
			{
			case 1:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
				break;
			case 2:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
				break;
			case 3:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
				break;
			default:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
			}

			// and copy the contents of the old array, offset them by current base
			for (unsigned int v = 0; v < iNumIndices;++v) {
				const unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED != was_copied_to[index]) {
					rFace.mIndices[v] = was_copied_to[index];
					continue;
				}

				// copy positions
				out_mesh->mVertices[out_mesh->mNumVertices] = (in_mesh->mVertices[index]);

				// copy normals
				if (in_mesh->HasNormals()) {
					out_mesh->mNormals[out_mesh->mNumVertices] = (in_mesh->mNormals[index]);
				}

				// copy tangents/bi-tangents
				if (in_mesh->HasTangentsAndBitangents()) {
					out_mesh->mTangents[out_mesh->mNumVertices] = (in_mesh->mTangents[index]);
					out_mesh->mBitangents[out_mesh->mNumVertices] = (in_mesh->mBitangents[index]);
				}

				// texture coordinates
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
					if (in_mesh->HasTextureCoords( c)) {
						out_mesh->mTextureCoords[c][out_mesh->mNumVertices] = in_mesh->mTextureCoords[c][index];
					}
				}
				// vertex colors 
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
					if (in_mesh->HasVertexColors( c)) {
						out_mesh->mColors[c][out_mesh->mNumVertices] = in_mesh->mColors[c][index];
					}
				}
				// check whether we have bone weights assigned to this vertex
				rFace.mIndices[v] = out_mesh->mNumVertices;
				if (avPerVertexWeights) {
					VertexWeightTable& table = avPerVertexWeights[ out_mesh->mNumVertices ];
					for (VertexWeightTable::const_iterator iter = table.begin(), end = table.end(); iter != end;++iter) {
						// allocate the bone weight array if necessary and store it in the mBones field (HACK!)
						BoneWeightList* weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[(*iter).first]);
						if (!weight_list) {
							weight_list = new BoneWeightList();
							out_mesh->mBones[(*iter).first] = reinterpret_cast<aiBone*>(weight_list);
						}
						weight_list->push_back(aiVertexWeight(out_mesh->mNumVertices,(*iter).second));
					}
				}

				was_copied_to[index] = out_mesh->mNumVertices;
				out_mesh->mNumVertices++;
			}
			base++;
			if(out_mesh->mNumVertices == out_vertex_index) {
				// break here. The face is only added if it was complete
				break;
			}
		}

		// check which bones we'll need to create for this submesh
		if (in_mesh->HasBones()) {
			aiBone** ppCurrent = out_mesh->mBones;
			for (unsigned int k = 0; k < in_mesh->mNumBones;++k) {
				// check whether the bone exists
				BoneWeightList* const weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[k]);

				if (weight_list) {
					const aiBone* const bone_in = in_mesh->mBones[k];
					aiBone* const bone_out = new aiBone();
					*ppCurrent++ = bone_out;
					bone_out->mName = aiString(bone_in->mName);
					bone_out->mOffsetMatrix =bone_in->mOffsetMatrix;
					bone_out->mNumWeights = (unsigned int)weight_list->size();
					bone_out->mWeights = new aiVertexWeight[bone_out->mNumWeights];

					// copy the vertex weights
					::memcpy(bone_out->mWeights, &(*weight_list)[0],bone_out->mNumWeights * sizeof(aiVertexWeight));

					delete weight_list;
					out_mesh->mNumBones++;
				}
			}
		}

		// copy the face list to the mesh
		out_mesh->mFaces = new aiFace[vFaces.size()];
		out_mesh->mNumFaces = (unsigned int)vFaces.size();

		for (unsigned int p = 0; p < out_mesh->mNumFaces;++p) {
			out_mesh->mFaces[p] = vFaces[p];
		}

		// add the newly created mesh to the list
		source_mesh_map.push_back(std::make_pair(out_mesh,a));

		if (base == in_mesh->mNumFaces) {
			break;
		}
	}

	// delete the per-vertex weight list again
	delete[] avPerVertexWeights;

	// now delete the old mesh data
	delete in_mesh;
}